

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O3

void __thiscall
soplex::
SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scale(SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lp,bool persistent)

{
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  char cVar1;
  int iVar2;
  long lVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  DataArray<int> *pDVar5;
  byte bVar6;
  char *pcVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  uint *puVar9;
  DataArray<int> *pDVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vecset;
  SPxOut *pSVar12;
  byte bVar13;
  Real a;
  Verbosity old_verbosity_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowratio;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  colratio;
  Verbosity local_9bc;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined5 uStack_950;
  undefined3 uStack_94b;
  int iStack_948;
  undefined1 uStack_944;
  undefined8 local_940;
  cpp_dec_float<200U,_int,_void> local_930;
  cpp_dec_float<200U,_int,_void> local_8b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_830;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_730;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar13 = 0;
  pSVar12 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).spxout;
  if ((pSVar12 != (SPxOut *)0x0) && (2 < (int)pSVar12->m_verbosity)) {
    local_930.data._M_elems[0] = 3;
    local_8b0.data._M_elems[0] = pSVar12->m_verbosity;
    (*pSVar12->_vptr_SPxOut[2])();
    pSVar12 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar12->m_streams[pSVar12->m_verbosity],"Equilibrium scaling LP",0x16);
    pcVar7 = "";
    if (persistent) {
      pcVar7 = " (persistent)";
    }
    lVar3 = 0xd;
    if (!persistent) {
      lVar3 = 0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar12->m_streams[pSVar12->m_verbosity],pcVar7,lVar3);
    cVar1 = (char)pSVar12->m_streams[pSVar12->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar12->m_streams[pSVar12->m_verbosity] + -0x18)
                    + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    pSVar12 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    (*pSVar12->_vptr_SPxOut[2])(pSVar12,&local_8b0);
  }
  (**(this->
     super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     )._vptr_SPxScaler)(this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x33])(&local_8b0,this,lp);
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[0x34])(&local_930,this,lp);
  this_00 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_00);
  local_940._0_4_ = cpp_dec_float_finite;
  local_940._4_4_ = 0x1c;
  local_9b8 = 0;
  uStack_9b0 = 0;
  local_9a8 = 0;
  uStack_9a0 = 0;
  local_998 = 0;
  uStack_990 = 0;
  local_988 = 0;
  uStack_980 = 0;
  local_978 = 0;
  uStack_970 = 0;
  local_968 = 0;
  uStack_960 = 0;
  local_958 = 0;
  uStack_950 = 0;
  uStack_94b = 0;
  iStack_948 = 0;
  uStack_944 = 0;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_9b8,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  bVar6 = 0;
  if ((local_8b0.fpclass != cpp_dec_float_NaN) &&
     (bVar6 = 0, local_930.fpclass != cpp_dec_float_NaN)) {
    iVar2 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_8b0,&local_930);
    bVar6 = (byte)((uint)iVar2 >> 0x1f);
  }
  pSVar12 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).spxout;
  if ((pSVar12 != (SPxOut *)0x0) && (3 < (int)pSVar12->m_verbosity)) {
    local_9bc = pSVar12->m_verbosity;
    (*pSVar12->_vptr_SPxOut[2])();
    pSVar12 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar12->m_streams[pSVar12->m_verbosity],"before scaling:",0xf);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar12->m_streams[pSVar12->m_verbosity]," min= ",6);
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[3])(&local_b0,lp,1);
    boost::multiprecision::operator<<(pSVar12->m_streams[pSVar12->m_verbosity],&local_b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar12->m_streams[pSVar12->m_verbosity]," max= ",6);
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[4])(&local_130,lp,1);
    boost::multiprecision::operator<<(pSVar12->m_streams[pSVar12->m_verbosity],&local_130);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar12->m_streams[pSVar12->m_verbosity]," col-ratio= ",0xc);
    pcVar8 = &local_8b0;
    pnVar4 = &local_1b0;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pnVar4->m_backend).data._M_elems[0] = (pcVar8->data)._M_elems[0];
      pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + ((ulong)bVar13 * -2 + 1) * 4);
      pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar4 + ((ulong)bVar13 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = local_8b0.exp;
    local_1b0.m_backend.neg = local_8b0.neg;
    boost::multiprecision::operator<<(pSVar12->m_streams[pSVar12->m_verbosity],&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar12->m_streams[pSVar12->m_verbosity]," row-ratio= ",0xc);
    pcVar8 = &local_930;
    pnVar4 = &local_230;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pnVar4->m_backend).data._M_elems[0] = (pcVar8->data)._M_elems[0];
      pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + ((ulong)bVar13 * -2 + 1) * 4);
      pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar4 + ((ulong)bVar13 * -2 + 1) * 4);
    }
    local_230.m_backend.exp = local_930.exp;
    local_230.m_backend.neg = local_930.neg;
    boost::multiprecision::operator<<(pSVar12->m_streams[pSVar12->m_verbosity],&local_230);
    cVar1 = (char)pSVar12->m_streams[pSVar12->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar12->m_streams[pSVar12->m_verbosity] + -0x18)
                    + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    pSVar12 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    (*pSVar12->_vptr_SPxOut[2])(pSVar12,&local_9bc);
  }
  if (bVar6 == 0) {
    pDVar10 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_activeColscaleExp;
    pDVar5 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_activeRowscaleExp;
    puVar9 = (uint *)&local_9b8;
    pnVar4 = &local_3b0;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pnVar4->m_backend).data._M_elems[0] = *puVar9;
      puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
      pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar4 + ((ulong)bVar13 * -2 + 1) * 4);
    }
    local_3b0.m_backend.exp = iStack_948;
    local_3b0.m_backend.neg = (bool)uStack_944;
    local_3b0.m_backend.fpclass = (fpclass_type)local_940;
    local_3b0.m_backend.prec_elem = local_940._4_4_;
    computeEquiExpVec((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)lp,pDVar10,pDVar5,&local_3b0);
    if ((this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_doBoth != true) goto LAB_005883be;
    vecset = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)&lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    pDVar5 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_activeColscaleExp;
    pDVar10 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_activeRowscaleExp;
    pnVar4 = &local_430;
    puVar9 = (uint *)&local_9b8;
    pnVar11 = pnVar4;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pnVar11->m_backend).data._M_elems[0] = *puVar9;
      puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar13 * -2 + 1) * 4);
    }
    local_430.m_backend.exp = iStack_948;
    local_430.m_backend.neg = (bool)uStack_944;
    local_430.m_backend.fpclass = (fpclass_type)local_940;
    local_430.m_backend.prec_elem = local_940._4_4_;
  }
  else {
    pDVar10 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_activeColscaleExp;
    pDVar5 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_activeRowscaleExp;
    puVar9 = (uint *)&local_9b8;
    pnVar4 = &local_2b0;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pnVar4->m_backend).data._M_elems[0] = *puVar9;
      puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
      pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar4 + ((ulong)bVar13 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = iStack_948;
    local_2b0.m_backend.neg = (bool)uStack_944;
    local_2b0.m_backend.fpclass = (fpclass_type)local_940;
    local_2b0.m_backend.prec_elem = local_940._4_4_;
    computeEquiExpVec(&(lp->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ,pDVar5,pDVar10,&local_2b0);
    if ((this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).m_doBoth != true) goto LAB_005883be;
    pDVar10 = (this->
              super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).m_activeColscaleExp;
    pDVar5 = (this->
             super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_activeRowscaleExp;
    pnVar4 = &local_330;
    puVar9 = (uint *)&local_9b8;
    pnVar11 = pnVar4;
    for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pnVar11->m_backend).data._M_elems[0] = *puVar9;
      puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
      pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar11 + ((ulong)bVar13 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = iStack_948;
    local_330.m_backend.neg = (bool)uStack_944;
    local_330.m_backend.fpclass = (fpclass_type)local_940;
    local_330.m_backend.prec_elem = local_940._4_4_;
    vecset = lp;
  }
  computeEquiExpVec((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)vecset,pDVar10,pDVar5,pnVar4);
LAB_005883be:
  (*(this->
    super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    )._vptr_SPxScaler[2])(this,lp);
  pSVar12 = (this->
            super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).spxout;
  if (pSVar12 != (SPxOut *)0x0) {
    local_9bc = pSVar12->m_verbosity;
    if (4 < (int)local_9bc) {
      (*pSVar12->_vptr_SPxOut[2])();
      pSVar12 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity],"Row scaling min= ",0x11);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x31])(&local_4b0,this);
      boost::multiprecision::operator<<(pSVar12->m_streams[pSVar12->m_verbosity],&local_4b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity]," max= ",6);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x32])(&local_530,this);
      boost::multiprecision::operator<<(pSVar12->m_streams[pSVar12->m_verbosity],&local_530);
      cVar1 = (char)pSVar12->m_streams[pSVar12->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar12->m_streams[pSVar12->m_verbosity] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity],"Col scaling min= ",0x11);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x2f])(&local_5b0,this);
      boost::multiprecision::operator<<(pSVar12->m_streams[pSVar12->m_verbosity],&local_5b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity]," max= ",6);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x30])(&local_630,this);
      boost::multiprecision::operator<<(pSVar12->m_streams[pSVar12->m_verbosity],&local_630);
      cVar1 = (char)pSVar12->m_streams[pSVar12->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar12->m_streams[pSVar12->m_verbosity] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      pSVar12 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar12->_vptr_SPxOut[2])(pSVar12,&local_9bc);
      pSVar12 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      if (pSVar12 == (SPxOut *)0x0) {
        return;
      }
    }
    local_9bc = pSVar12->m_verbosity;
    if (3 < (int)local_9bc) {
      (*pSVar12->_vptr_SPxOut[2])();
      pSVar12 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity],"after scaling: ",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity]," min= ",6);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[3])(&local_6b0,lp,0);
      boost::multiprecision::operator<<(pSVar12->m_streams[pSVar12->m_verbosity],&local_6b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity]," max= ",6);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[4])(&local_730,lp,0);
      boost::multiprecision::operator<<(pSVar12->m_streams[pSVar12->m_verbosity],&local_730);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity]," col-ratio= ",0xc);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x33])(&local_7b0,this,lp);
      boost::multiprecision::operator<<(pSVar12->m_streams[pSVar12->m_verbosity],&local_7b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar12->m_streams[pSVar12->m_verbosity]," row-ratio= ",0xc);
      (*(this->
        super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        )._vptr_SPxScaler[0x34])(&local_830,this,lp);
      boost::multiprecision::operator<<(pSVar12->m_streams[pSVar12->m_verbosity],&local_830);
      cVar1 = (char)pSVar12->m_streams[pSVar12->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar12->m_streams[pSVar12->m_verbosity] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      pSVar12 = (this->
                super_SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar12->_vptr_SPxOut[2])(pSVar12,&local_9bc);
    }
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Equilibrium scaling LP" <<
                 (persistent ? " (persistent)" : "") << std::endl;)

   this->setup(lp);

   /* We want to do the direction first, which has a lower maximal ratio,
    * since the lowest value in the scaled matrix is bounded from below by
    * the inverse of the maximum ratio of the direction that is done first
    * Example:
    *
    *                     Rowratio
    *            0.1  1   10
    *            10   1   10
    *
    * Colratio   100  1
    *
    * Row first =>         Col next =>
    *            0.1  1          0.1  1
    *            1    0.1        1    0.1
    *
    * Col first =>         Row next =>
    *            0.01 1          0.01 1
    *            1    1          1    1
    *
    */
   R colratio = this->maxColRatio(lp);
   R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   bool colFirst = colratio < rowratio;

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   if(colFirst)
   {
      computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);
   }
   else
   {
      computeEquiExpVec(lp.rowSet(), *this->m_activeColscaleExp, *this->m_activeRowscaleExp, epsilon);

      if(this->m_doBoth)
         computeEquiExpVec(lp.colSet(), *this->m_activeRowscaleExp, *this->m_activeColscaleExp, epsilon);
   }

   /* scale */
   this->applyScaling(lp);

   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                 << " max= " << this->maxAbsRowscale()
                 << std::endl
                 << "Col scaling min= " << this->minAbsColscale()
                 << " max= " << this->maxAbsColscale()
                 << std::endl;)

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                 << " min= " << lp.minAbsNzo(false)
                 << " max= " << lp.maxAbsNzo(false)
                 << " col-ratio= " << this->maxColRatio(lp)
                 << " row-ratio= " << this->maxRowRatio(lp)
                 << std::endl;)

}